

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QGlyphRun>::
appendIteratorRange<QHash<std::pair<QFontEngine*,int>,QGlyphRun>::const_iterator>
          (QCommonArrayOps<QGlyphRun> *this,const_iterator b,const_iterator e,
          IfIsForwardIterator<QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun>::const_iterator>
          param_4)

{
  long lVar1;
  const_iterator __last;
  const_iterator __first;
  bool bVar2;
  const_iterator *this_00;
  size_t *this_01;
  size_t in_RCX;
  size_t in_RSI;
  Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *in_RDI;
  Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *in_R8;
  long in_FS_OFFSET;
  QGlyphRun *iter;
  qsizetype distance;
  const_iterator *pcVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first.i.bucket = in_RSI;
  __first.i.d = in_R8;
  __last.i.bucket = in_RCX;
  __last.i.d = in_RDI;
  this_00 = (const_iterator *)
            std::distance<QHash<std::pair<QFontEngine*,int>,QGlyphRun>::const_iterator>
                      (__first,__last);
  this_01 = (size_t *)QArrayDataPointer<QGlyphRun>::end((QArrayDataPointer<QGlyphRun> *)in_RDI);
  while( true ) {
    bVar2 = QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun>::const_iterator::operator!=
                      ((const_iterator *)this_01,(const_iterator *)in_RDI);
    if (!bVar2) break;
    pcVar3 = (const_iterator *)this_01;
    QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun>::const_iterator::operator*
              ((const_iterator *)0x887dff);
    QGlyphRun::QGlyphRun((QGlyphRun *)in_RDI,(QGlyphRun *)this_01);
    in_RDI->numBuckets = in_RDI->numBuckets + 1;
    this_01 = &(pcVar3->i).bucket;
    QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun>::const_iterator::operator++(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }